

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O2

void Sbd_ManPrintObj(Sbd_Man_t *p,int Pivot)

{
  Vec_Wrd_t *p_00;
  FILE *pFile;
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int i;
  word *pwVar5;
  word *pwVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  int i_00;
  ulong uVar11;
  int iVar12;
  int i_01;
  ulong uVar13;
  
  iVar1 = Vec_IntEntry(p->vObj2Var,Pivot);
  for (iVar12 = 0; iVar12 <= iVar1; iVar12 = iVar12 + 1) {
    uVar2 = Vec_IntEntry(p->vWinObjs,iVar12);
    printf("%3d : ",(ulong)uVar2);
    pFile = _stdout;
    pwVar5 = Sbd_ObjSim0(p,uVar2);
    Extra_PrintBinary(pFile,(uint *)pwVar5,0x40);
    putchar(10);
  }
  if (p->Pivot != Pivot) {
    __assert_fail("p->Pivot == Pivot",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                  ,0x29b,"void Sbd_ManPrintObj(Sbd_Man_t *, int)");
  }
  p->vCounts[0]->nSize = 0;
  p->vCounts[1]->nSize = 0;
  printf("Node %d.  Useful divisors = %d.\n",Pivot,(ulong)(uint)p->vDivValues->nSize);
  printf("Lev : ");
  for (iVar12 = 0; iVar12 <= iVar1; iVar12 = iVar12 + 1) {
    iVar3 = Vec_IntEntry(p->vWinObjs,iVar12);
    if (iVar1 == iVar12) {
      putchar(0x20);
    }
    Vec_IntEntry(p->vLutLevs,iVar3);
    printf("%d");
  }
  putchar(10);
  putchar(10);
  if (0x62 < iVar1) {
    printf("    : ");
    for (iVar12 = 0; iVar1 + 1 != iVar12; iVar12 = iVar12 + 1) {
      iVar3 = Vec_IntEntry(p->vWinObjs,iVar12);
      if (iVar1 == iVar12) {
        putchar(0x20);
      }
      printf("%d",(long)iVar3 / 100 & 0xffffffff,(long)iVar3 % 100 & 0xffffffff);
    }
    putchar(10);
  }
  if (8 < iVar1) {
    printf("    : ");
    for (iVar12 = 0; iVar1 + 1 != iVar12; iVar12 = iVar12 + 1) {
      Vec_IntEntry(p->vWinObjs,iVar12);
      if (iVar1 == iVar12) {
        putchar(0x20);
      }
      printf("%d");
    }
    putchar(10);
  }
  if (-1 < iVar1) {
    printf("    : ");
    for (iVar12 = 0; iVar1 + 1 != iVar12; iVar12 = iVar12 + 1) {
      Vec_IntEntry(p->vWinObjs,iVar12);
      if (iVar1 == iVar12) {
        putchar(0x20);
      }
      printf("%d");
    }
    putchar(10);
    putchar(10);
  }
  uVar7 = 0;
  while (uVar2 = (uint)uVar7, (int)uVar2 < p->pPars->nWords * 0x40) {
    pwVar5 = Sbd_ObjSim2(p,Pivot);
    uVar13 = uVar7 >> 6;
    uVar10 = (ulong)(uVar2 & 0x3f);
    uVar11 = 1L << (sbyte)(uVar2 & 0x3f);
    if ((pwVar5[uVar13] >> (uVar7 & 0x3f) & 1) != 0) {
      printf("%3d : ");
      for (iVar12 = 0; iVar12 <= iVar1; iVar12 = iVar12 + 1) {
        iVar3 = Vec_IntEntry(p->vWinObjs,iVar12);
        pwVar5 = Sbd_ObjSim0(p,iVar3);
        pwVar6 = Sbd_ObjSim2(p,iVar3);
        if (iVar1 == iVar12) {
          if ((pwVar6[uVar13] & uVar11) != 0) {
            Vec_IntPush(p->vCounts[(pwVar5[uVar13] >> uVar10 & 1) != 0],uVar2);
          }
          putchar(0x20);
        }
        iVar3 = 0x2e;
        if ((pwVar6[uVar13] & uVar11) != 0) {
          iVar3 = ((pwVar5[uVar13] >> uVar10 & 1) != 0) + 0x30;
        }
        putchar(iVar3);
      }
      putchar(10);
      printf("%3d : ",uVar7);
      for (iVar12 = 0; iVar12 <= iVar1; iVar12 = iVar12 + 1) {
        iVar3 = Vec_IntEntry(p->vWinObjs,iVar12);
        pwVar5 = Sbd_ObjSim0(p,iVar3);
        pwVar6 = Sbd_ObjSim3(p,iVar3);
        if (iVar1 == iVar12) {
          if ((pwVar6[uVar13] & uVar11) != 0) {
            Vec_IntPush(p->vCounts[(pwVar5[uVar13] >> uVar10 & 1) != 0],uVar2);
          }
          putchar(0x20);
        }
        iVar3 = 0x2e;
        if ((pwVar6[uVar13] & uVar11) != 0) {
          iVar3 = ((pwVar5[uVar13] >> uVar10 & 1) != 0) + 0x30;
        }
        putchar(iVar3);
      }
      putchar(10);
      printf("Sims: ");
      for (iVar12 = 0; iVar12 <= iVar1; iVar12 = iVar12 + 1) {
        iVar3 = Vec_IntEntry(p->vWinObjs,iVar12);
        pwVar5 = Sbd_ObjSim0(p,iVar3);
        if (iVar1 == iVar12) {
          putchar(0x20);
        }
        putchar(((pwVar5[uVar13] >> uVar10 & 1) != 0) + 0x30);
      }
      putchar(10);
      printf("Ctrl: ");
      for (iVar12 = 0; iVar12 <= iVar1; iVar12 = iVar12 + 1) {
        iVar3 = Vec_IntEntry(p->vWinObjs,iVar12);
        pwVar5 = Sbd_ObjSim2(p,iVar3);
        if (iVar1 == iVar12) {
          putchar(0x20);
        }
        putchar(((pwVar5[uVar13] >> uVar10 & 1) != 0) + 0x30);
      }
      putchar(10);
      putchar(10);
    }
    uVar7 = (ulong)(uVar2 + 1);
  }
  printf("Exploring %d x %d covering table.\n",(ulong)(uint)p->vCounts[0]->nSize,
         (ulong)(uint)p->vCounts[1]->nSize);
  p->vMatrix->nSize = 0;
  iVar12 = 0;
  do {
    iVar3 = p->vCounts[0]->nSize;
    if (0x3f < iVar3) {
      iVar3 = 0x40;
    }
    if (iVar3 <= iVar12) {
      return;
    }
    iVar3 = Vec_IntEntry(p->vCounts[0],iVar12);
    bVar8 = (byte)iVar3 & 0x3f;
    i_00 = 0;
    while( true ) {
      iVar4 = p->vCounts[1]->nSize;
      if (0x3f < iVar4) {
        iVar4 = 0x40;
      }
      if (iVar4 <= i_00) break;
      iVar4 = Vec_IntEntry(p->vCounts[1],i_00);
      bVar9 = (byte)iVar4 & 0x3f;
      uVar13 = 0;
      uVar7 = 0;
      while (i_01 = (int)uVar7, i_01 <= iVar1) {
        i = Vec_IntEntry(p->vWinObjs,i_01);
        pwVar5 = Sbd_ObjSim0(p,i);
        pwVar6 = Sbd_ObjSim2(p,i);
        if ((((pwVar6[iVar3 >> 6] & 1L << bVar8) != 0) && ((pwVar6[iVar4 >> 6] & 1L << bVar9) != 0))
           && ((((uint)(pwVar5[iVar4 >> 6] >> bVar9) ^ (uint)(pwVar5[iVar3 >> 6] >> bVar8)) & 1) !=
               0)) {
          uVar13 = uVar13 ^ 1L << (uVar7 & 0x3f);
        }
        uVar7 = (ulong)(i_01 + 1);
      }
      p_00 = p->vMatrix;
      uVar7 = (ulong)(uint)p_00->nSize;
      if (p_00->nSize < 1) {
        uVar7 = 0;
      }
      uVar10 = 0;
      while (uVar7 != uVar10) {
        pwVar5 = p_00->pArray + uVar10;
        uVar10 = uVar10 + 1;
        if (*pwVar5 == uVar13) goto LAB_00457d12;
      }
      Vec_WrdPush(p_00,uVar13);
      for (uVar7 = 0; (long)uVar7 <= (long)iVar1; uVar7 = uVar7 + 1) {
        printf("%d",(ulong)((uVar13 >> (uVar7 & 0x3f) & 1) != 0));
      }
      putchar(10);
LAB_00457d12:
      i_00 = i_00 + 1;
    }
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

void Sbd_ManPrintObj( Sbd_Man_t * p, int Pivot )
{
    int nDivs = Vec_IntEntry(p->vObj2Var, Pivot) + 1;
    int i, k, k0, k1, Id, Bit0, Bit1;

    Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        printf( "%3d : ", Id ), Extra_PrintBinary( stdout, (unsigned *)Sbd_ObjSim0(p, Id), 64 ), printf( "\n" );

    assert( p->Pivot == Pivot );
    Vec_IntClear( p->vCounts[0] );
    Vec_IntClear( p->vCounts[1] );

    printf( "Node %d.  Useful divisors = %d.\n", Pivot, Vec_IntSize(p->vDivValues) );
    printf( "Lev : " );
    Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
    {
        if ( i == nDivs-1 )
            printf( " " );
        printf( "%d", Vec_IntEntry(p->vLutLevs, Id) );
    }
    printf( "\n" );
    printf( "\n" );

    if ( nDivs > 99 )
    {
        printf( "    : " );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%d", Id / 100 );
        }
        printf( "\n" );
    }
    if ( nDivs > 9 )
    {
        printf( "    : " );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%d", (Id % 100) / 10 );
        }
        printf( "\n" );
    }
    if ( nDivs > 0 )
    {
        printf( "    : " );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%d", Id % 10 );
        }
        printf( "\n" );
        printf( "\n" );
    }

    // sampling matrix
    for ( k = 0; k < p->pPars->nWords * 64; k++ )
    {
        if ( !Abc_TtGetBit(Sbd_ObjSim2(p, Pivot), k) )
            continue;

        printf( "%3d : ", k );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            word * pSims = Sbd_ObjSim0( p, Id );
            word * pCtrl = Sbd_ObjSim2( p, Id );
            if ( i == nDivs-1 )
            {
                if ( Abc_TtGetBit(pCtrl, k) )
                    Vec_IntPush( p->vCounts[Abc_TtGetBit(pSims, k)], k );
                printf( " " );
            }
            printf( "%c", Abc_TtGetBit(pCtrl, k) ? '0' + Abc_TtGetBit(pSims, k) : '.' );
        }
        printf( "\n" );

        printf( "%3d : ", k );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            word * pSims = Sbd_ObjSim0( p, Id );
            word * pCtrl = Sbd_ObjSim3( p, Id );
            if ( i == nDivs-1 )
            {
                if ( Abc_TtGetBit(pCtrl, k) )
                    Vec_IntPush( p->vCounts[Abc_TtGetBit(pSims, k)], k );
                printf( " " );
            }
            printf( "%c", Abc_TtGetBit(pCtrl, k) ? '0' + Abc_TtGetBit(pSims, k) : '.' );
        }
        printf( "\n" );

        printf( "Sims: " );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            word * pSims = Sbd_ObjSim0( p, Id );
            //word * pCtrl = Sbd_ObjSim2( p, Id );
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%c", '0' + Abc_TtGetBit(pSims, k) );
        }
        printf( "\n" );

        printf( "Ctrl: " );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            //word * pSims = Sbd_ObjSim0( p, Id );
            word * pCtrl = Sbd_ObjSim2( p, Id );
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%c", '0' + Abc_TtGetBit(pCtrl, k) );
        }
        printf( "\n" );


        printf( "\n" );
    }
    // covering table
    printf( "Exploring %d x %d covering table.\n", Vec_IntSize(p->vCounts[0]), Vec_IntSize(p->vCounts[1]) );
/*
    Vec_IntForEachEntryStop( p->vCounts[0], Bit0, k0, Abc_MinInt(Vec_IntSize(p->vCounts[0]), 8) )
    Vec_IntForEachEntryStop( p->vCounts[1], Bit1, k1, Abc_MinInt(Vec_IntSize(p->vCounts[1]), 8) )
    {
        printf( "%3d %3d : ", Bit0, Bit1 );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            word * pSims = Sbd_ObjSim0( p, Id );
            word * pCtrl = Sbd_ObjSim2( p, Id );
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%c", (Abc_TtGetBit(pCtrl, Bit0) && Abc_TtGetBit(pCtrl, Bit1) && Abc_TtGetBit(pSims, Bit0) != Abc_TtGetBit(pSims, Bit1)) ? '1' : '.' );
        }
        printf( "\n" );
    }
*/
    Vec_WrdClear( p->vMatrix );
    Vec_IntForEachEntryStop( p->vCounts[0], Bit0, k0, Abc_MinInt(Vec_IntSize(p->vCounts[0]), 64) )
    Vec_IntForEachEntryStop( p->vCounts[1], Bit1, k1, Abc_MinInt(Vec_IntSize(p->vCounts[1]), 64) )
    {
        word Row = 0;
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            word * pSims = Sbd_ObjSim0( p, Id );
            word * pCtrl = Sbd_ObjSim2( p, Id );
            if ( Abc_TtGetBit(pCtrl, Bit0) && Abc_TtGetBit(pCtrl, Bit1) && Abc_TtGetBit(pSims, Bit0) != Abc_TtGetBit(pSims, Bit1) )
                Abc_TtXorBit( &Row, i );
        }
        if ( Vec_WrdPushUnique( p->vMatrix, Row ) )
            continue;
        for ( i = 0; i < nDivs; i++ )
            printf( "%d", (int)((Row >> i) & 1) );
        printf( "\n" );
    }
}